

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O1

h264_cabac_context * h264_cabac_new(h264_slice *slice)

{
  h264_cabac_context *phVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint8_t uVar6;
  int iVar7;
  
  phVar1 = (h264_cabac_context *)calloc(0x830,1);
  phVar1->slice = slice;
  lVar2 = 0;
  lVar4 = 0;
  if ((slice->slice_type != 2) && (slice->slice_type != 4)) {
    lVar4 = (long)(int)(slice->cabac_init_idc + 1);
  }
  iVar3 = 0x33;
  if (slice->sliceqpy < 0x33) {
    iVar3 = slice->sliceqpy;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  do {
    iVar5 = (int)*(char *)(lVar4 * 2 + 0x116f51 + lVar2 * 8) +
            (ctx_init_tab[lVar2][lVar4].m * iVar3 >> 4);
    iVar7 = 0x7e;
    if (iVar5 < 0x7e) {
      iVar7 = iVar5;
    }
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    uVar6 = (char)iVar7 + 0xc0;
    if (iVar5 < 0x40) {
      uVar6 = '?' - (char)iVar7;
    }
    phVar1->pStateIdx[lVar2] = uVar6;
    phVar1->valMPS[lVar2] = 0x3f < iVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x407);
  return phVar1;
}

Assistant:

struct h264_cabac_context *h264_cabac_new(struct h264_slice *slice) {
	struct h264_cabac_context *cabac = calloc (sizeof *cabac, 1);
	cabac->slice = slice;
	int i;
	int mode;
	if (slice->slice_type == H264_SLICE_TYPE_I || slice->slice_type == H264_SLICE_TYPE_SI)
		mode = 0;
	else
		mode = slice->cabac_init_idc + 1;
	for (i = 0; i < H264_CABAC_CTXIDX_NUM; i++)
		init_ctx(cabac, i, &ctx_init_tab[i][mode]);
	return cabac;
}